

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

bool sentencepiece::TrainerSpec_ModelType_Parse(ConstStringParam name,TrainerSpec_ModelType *value)

{
  bool bVar1;
  undefined4 *in_RSI;
  bool success;
  int int_value;
  EnumEntry *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  StringPiece *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  google::protobuf::StringPiece::StringPiece<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    (in_stack_00000028,(size_t)name,(StringPiece)in_stack_00000030,(int *)value);
  if (bVar1) {
    *in_RSI = local_14;
  }
  return bVar1;
}

Assistant:

bool TrainerSpec_ModelType_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, TrainerSpec_ModelType* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      TrainerSpec_ModelType_entries, 4, name, &int_value);
  if (success) {
    *value = static_cast<TrainerSpec_ModelType>(int_value);
  }
  return success;
}